

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O1

void printSORegRegOperand(MCInst *MI,uint OpNum,SStream *O)

{
  uint8_t *puVar1;
  cs_struct *pcVar2;
  cs_detail *pcVar3;
  uint uVar4;
  MCOperand *op;
  MCOperand *op_00;
  MCOperand *op_01;
  char *pcVar5;
  int64_t iVar6;
  uint uVar7;
  
  op = MCInst_getOperand(MI,OpNum);
  op_00 = MCInst_getOperand(MI,OpNum + 1);
  op_01 = MCInst_getOperand(MI,OpNum + 2);
  pcVar2 = MI->csh;
  uVar4 = MCOperand_getReg(op);
  pcVar5 = (*pcVar2->get_regname)(uVar4);
  SStream_concat0(O,pcVar5);
  if (MI->csh->detail != CS_OPT_OFF) {
    pcVar3 = MI->flat_insn->detail;
    puVar1 = pcVar3->groups + (ulong)(pcVar3->field_6).arm.op_count * 0x28 + 0x42;
    puVar1[0] = '\x01';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    uVar4 = MCOperand_getReg(op);
    pcVar3 = MI->flat_insn->detail;
    *(uint *)(pcVar3->groups + (ulong)(pcVar3->field_6).arm.op_count * 0x28 + 0x46) = uVar4;
    iVar6 = MCOperand_getImm(op_01);
    pcVar3 = MI->flat_insn->detail;
    *(uint *)(pcVar3->groups + (ulong)(pcVar3->field_6).arm.op_count * 0x28 + 0x3a) =
         ((uint)iVar6 & 7) + 5;
    puVar1 = &(MI->flat_insn->detail->field_6).arm.op_count;
    *puVar1 = *puVar1 + '\x01';
  }
  iVar6 = MCOperand_getImm(op_01);
  uVar7 = (uint)iVar6 & 7;
  SStream_concat0(O,", ");
  uVar4 = uVar7 - 1;
  if (uVar4 < 5) {
    pcVar5 = *(char **)(&DAT_00291750 + (ulong)uVar4 * 8);
  }
  else {
    pcVar5 = anon_var_dwarf_ecefe + 0x11;
  }
  SStream_concat0(O,pcVar5);
  if (uVar7 != 5) {
    SStream_concat0(O," ");
    pcVar2 = MI->csh;
    uVar4 = MCOperand_getReg(op_00);
    pcVar5 = (*pcVar2->get_regname)(uVar4);
    SStream_concat0(O,pcVar5);
    if (MI->csh->detail != CS_OPT_OFF) {
      uVar4 = MCOperand_getReg(op_00);
      pcVar3 = MI->flat_insn->detail;
      *(uint *)(pcVar3->groups + (ulong)(pcVar3->field_6).arm.op_count * 0x28 + 0x16) = uVar4;
    }
  }
  return;
}

Assistant:

static void printSORegRegOperand(MCInst *MI, unsigned OpNum, SStream *O)
{
	MCOperand *MO1 = MCInst_getOperand(MI, OpNum);
	MCOperand *MO2 = MCInst_getOperand(MI, OpNum+1);
	MCOperand *MO3 = MCInst_getOperand(MI, OpNum+2);
	ARM_AM_ShiftOpc ShOpc;

	printRegName(MI->csh, O, MCOperand_getReg(MO1));

	if (MI->csh->detail) {
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_REG;
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].reg = MCOperand_getReg(MO1);

		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].shift.type = (MCOperand_getImm(MO3) & 7) + ARM_SFT_ASR_REG - 1;
		MI->flat_insn->detail->arm.op_count++;
	}

	// Print the shift opc.
	ShOpc = ARM_AM_getSORegShOp((unsigned int)MCOperand_getImm(MO3));
	SStream_concat0(O, ", ");
	SStream_concat0(O, ARM_AM_getShiftOpcStr(ShOpc));
	if (ShOpc == ARM_AM_rrx)
		return;

	SStream_concat0(O, " ");
	printRegName(MI->csh, O, MCOperand_getReg(MO2));
	if (MI->csh->detail)
		MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count - 1].shift.value = MCOperand_getReg(MO2);
	//assert(ARM_AM_getSORegOffset(MO3.getImm()) == 0);
}